

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void update_message(void)

{
  int iVar1;
  MESSAGE *pMVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  MESSAGE *__s;
  MESSAGE **ppMVar6;
  float fVar7;
  
  iVar3 = al_get_display_width(screen);
  iVar4 = al_get_display_height(screen);
  if (msg != (MESSAGE *)0x0) {
    iVar4 = iVar4 / 2;
    ppMVar6 = &msg;
    __s = msg;
    do {
      iVar1 = __s->time;
      if (iVar1 < 100) {
        fVar7 = __s->x * 0.9 + (float)iVar3 * 0.05;
      }
      else {
        fVar7 = (float)(iVar1 + -100) + __s->x;
      }
      __s->x = fVar7;
      __s->y = (float)iVar4 * 0.1 + __s->y * 0.9;
      __s->time = iVar1 + 1;
      sVar5 = strlen(__s->text);
      pMVar2 = __s->next;
      if (fVar7 <= (float)((sVar5 >> 2) + (long)iVar3)) {
        ppMVar6 = &__s->next;
      }
      else {
        *ppMVar6 = pMVar2;
        free(__s);
      }
      iVar4 = iVar4 + 0x10;
      __s = pMVar2;
    } while (pMVar2 != (MESSAGE *)0x0);
  }
  return;
}

Assistant:

void update_message()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   MESSAGE **p = &msg;
   MESSAGE *m = msg;
   MESSAGE *tmp;
   int y = SCREEN_H/2;

   while (m) {
      if (m->time < 100) {
	 m->x *= 0.9;
	 m->x += (float)SCREEN_W * 0.05;
      }
      else {
	 m->x += (m->time - 100);
      }

      m->y *= 0.9;
      m->y += y * 0.1;

      m->time++;

      if (m->x > SCREEN_W + strlen(m->text)/4) {
	 *p = m->next;
	 tmp = m;
	 m = m->next;
	 free(tmp);
      }
      else {
	 p = &m->next;
	 m = m->next;
      }

      y += 16;
   }
}